

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supervisor.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_a0 [4];
  int error_value;
  Solution bestSolution;
  Solution newSolution;
  char **argv_local;
  int argc_local;
  
  name = *argv;
  setup_signals();
  if (argc != 1) {
    fprintf(_stderr,"%s no arguments allowed\n",name);
    exit(1);
  }
  setup_buffer();
  memset(&bestSolution.edges[7].end,0,0x44);
  memset(local_a0,0,0x44);
  bestSolution.edges[7].start = 0x7fffffff;
  fprintf(_stdout,"waiting for solutions from ./generator\n");
  do {
    if (terminate != 0) {
LAB_001013d7:
      fprintf(_stdout,"shutting down\n");
      set_state(0);
      sem_post((sem_t *)free_sem);
      clean_buffer();
      exit(0);
    }
    iVar1 = circ_buf_read((Solution *)&bestSolution.edges[7].end);
    if (iVar1 != 0) {
      if (iVar1 != 1) {
        fprintf(_stderr,"%s ERROR: error while reading buffer\n",name);
        exit(1);
      }
      goto LAB_001013d7;
    }
    if (0x7fffffff < bestSolution.edges[7].start) {
      memcpy(local_a0,&bestSolution.edges[7].end,0x44);
      printEdge((Edge *)&bestSolution.edges[7].end,0x7fffffff);
    }
  } while( true );
}

Assistant:

int main(int argc, const char **argv)
{
	name = argv[0];
	setup_signals();

	if (1 != argc)
	{
		USAGE();
	}

	setup_buffer();

	Solution newSolution = {.amount = INT_MAX};
	Solution bestSolution = {.amount = INT_MAX};

	fprintf(stdout, "waiting for solutions from ./generator\n");

	while (!terminate)
	{

		int error_value;
		if ((error_value = circ_buf_read(&newSolution)) != 0)
		{
			if (error_value == 1)
			{
				break;
			}
			ERROR_EXIT("error while reading buffer");
		}

		if (newSolution.amount == 0)
		{
			fprintf(stdout, "The graph is 3-colorable\n");
			break;
		}

		if (newSolution.amount < bestSolution.amount)
		{
			bestSolution = newSolution;
			printEdge(newSolution.edges, newSolution.amount);
		}
	}

	fprintf(stdout,"shutting down\n");
	set_state(0);
	sem_post(free_sem);

	clean_buffer();
	SUCCESS_EXIT();
}